

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O2

void __thiscall
mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::erase
          (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_> *this,
          gc_heap_ptr_untracked<mjs::object,_false> *elem)

{
  gc_table *pgVar1;
  gc_heap_ptr_untracked<mjs::object,_false> *pgVar2;
  
  pgVar1 = tab(this);
  if (pgVar1 + 1 <= elem) {
    pgVar2 = end(this);
    if (elem < pgVar2) {
      pgVar1 = tab(this);
      erase(this,(uint32_t)((ulong)((long)elem + (-0x10 - (long)pgVar1)) >> 2));
      return;
    }
  }
  __assert_fail("elem >= begin() && elem < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x3a,
                "void mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object, false>>::erase(T *) [T = mjs::gc_heap_ptr_untracked<mjs::object, false>]"
               );
}

Assistant:

void erase(T* elem) {
        assert(elem >= begin() && elem < end());
        erase(static_cast<uint32_t>(elem - begin()));
    }